

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O0

void __thiscall FileTest_Write_Test::TestBody(FileTest_Write_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  file write_end;
  file read_end;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  file *this_01;
  file *this_02;
  int line;
  char *in_stack_ffffffffffffff90;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertionResult local_40;
  void *local_30;
  size_t local_28;
  Message *in_stack_ffffffffffffffe8;
  AssertHelper *in_stack_fffffffffffffff0;
  
  this_01 = (file *)&stack0xfffffffffffffff4;
  fmt::v5::file::file(this_01);
  this_02 = (file *)&stack0xfffffffffffffff0;
  fmt::v5::file::file(this_02);
  fmt::v5::file::pipe(this_01,&this_02->fd_);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ::write((int)&stack0xfffffffffffffff0,local_30,local_28);
  fmt::v5::file::close((file *)&stack0xfffffffffffffff0,(int)local_30);
  read_abi_cxx11_((int)&stack0xffffffffffffffa0,&stack0xfffffffffffffff4,4);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)this_02,(char *)this_01,
             (char (*) [5])CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  line = (int)((ulong)this_02 >> 0x20);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x115b99)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,line,
               (char *)this_01);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x115be7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115c2d);
  fmt::v5::file::~file(this_01);
  fmt::v5::file::~file(this_01);
  return;
}

Assistant:

TEST(FileTest, Write) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  write(write_end, "test");
  write_end.close();
  EXPECT_READ(read_end, "test");
}